

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testInit
          (VaryingStructureMemberLocationTest *this)

{
  value_type local_24;
  testCase test_case_out;
  testCase test_case_in;
  GLuint stage;
  VaryingStructureMemberLocationTest *this_local;
  
  test_case_in.m_is_input = false;
  test_case_in._1_3_ = 0;
  for (; (uint)test_case_in._0_4_ < 6; test_case_in._0_4_ = test_case_in._0_4_ + 1) {
    if (test_case_in._0_4_ != 0) {
      test_case_out.m_is_input = true;
      test_case_out.m_stage = test_case_in._0_4_;
      local_24.m_is_input = false;
      local_24.m_stage = test_case_in._0_4_;
      std::
      vector<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase>_>
      ::push_back(&this->m_test_cases,&test_case_out);
      if (test_case_in._0_4_ != 5) {
        std::
        vector<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingStructureMemberLocationTest::testCase>_>
        ::push_back(&this->m_test_cases,&local_24);
      }
    }
  }
  return;
}

Assistant:

void VaryingStructureMemberLocationTest::testInit()
{
	for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
	{
		if (Utils::Shader::COMPUTE == stage)
		{
			continue;
		}

		testCase test_case_in  = { true, (Utils::Shader::STAGES)stage };
		testCase test_case_out = { false, (Utils::Shader::STAGES)stage };

		m_test_cases.push_back(test_case_in);

		if (Utils::Shader::FRAGMENT != stage)
		{
			m_test_cases.push_back(test_case_out);
		}
	}
}